

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidySetOutCharEncoding(TidyDoc tdoc,ctmbstr encnam)

{
  uint uVar1;
  Bool BVar2;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    uVar1 = prvTidyCharEncodingId((TidyDocImpl *)tdoc,encnam);
    if ((-1 < (int)uVar1) &&
       (BVar2 = prvTidySetOptionInt((TidyDocImpl *)tdoc,TidyOutCharEncoding,(ulong)uVar1),
       BVar2 != no)) {
      return 0;
    }
    prvTidyReportBadArgument((TidyDocImpl *)tdoc,"out-char-encoding");
  }
  return -0x16;
}

Assistant:

int TIDY_CALL           tidySetOutCharEncoding( TidyDoc tdoc, ctmbstr encnam )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        int enc = TY_(CharEncodingId)( impl, encnam );
        if ( enc >= 0 && TY_(SetOptionInt)( impl, TidyOutCharEncoding, enc ) )
            return 0;

        TY_(ReportBadArgument)( impl, "out-char-encoding" );
    }
    return -EINVAL;
}